

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_decoder.c
# Opt level: O2

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,asn_struct_ctx_t *opt_ctx,
              void *ptr,size_t size,int tag_mode,int last_tag_form,ber_tlv_len_t *last_length,
              int *opt_tlv_form)

{
  size_t num_1;
  ssize_t sVar1;
  ssize_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  asn_dec_rval_t aVar11;
  undefined8 uStack_70;
  int local_5c;
  uint local_4c;
  ber_tlv_tag_t tlv_tag;
  int local_44;
  asn_TYPE_descriptor_t *local_40;
  ber_tlv_len_t tlv_len;
  
  if (opt_ctx == (asn_struct_ctx_t *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = (int)opt_ctx->step;
  }
  if ((opt_codec_ctx != (asn_codec_ctx_t *)0x0) &&
     (sVar5 = opt_codec_ctx->max_stack_size, sVar5 != 0)) {
    lVar9 = (long)opt_codec_ctx - (long)&tlv_len;
    lVar6 = -lVar9;
    if (lVar9 < 1) {
      lVar6 = lVar9;
    }
    if (SBORROW8(lVar6,-sVar5) != (long)(lVar6 + sVar5) < 0) {
      sVar5 = 0;
      uStack_70 = 2;
      goto LAB_00149541;
    }
  }
  iVar7 = local_5c - (uint)(tag_mode == 1);
  local_4c = 0xffffffff;
  local_44 = tag_mode;
  local_40 = td;
  if ((tag_mode != 0) || (iVar7 != td->tags_count)) {
    sVar5 = 0;
LAB_0014938c:
    iVar8 = 0;
    sVar4 = 0xffffffffffffffff;
    for (lVar6 = (long)iVar7; lVar6 < local_40->tags_count; lVar6 = lVar6 + 1) {
      sVar1 = ber_fetch_tag(ptr,size,&tlv_tag);
      ber_tlv_tag_string(tlv_tag);
      if (sVar1 == 0) {
LAB_001494f6:
        uStack_70 = 1;
        if (opt_ctx != (asn_struct_ctx_t *)0x0) goto LAB_0014955e;
LAB_00149569:
        sVar5 = 0;
        goto LAB_0014956b;
      }
      if (sVar1 == -1) {
joined_r0x00149557:
        uStack_70 = 2;
        if (opt_ctx == (asn_struct_ctx_t *)0x0) goto LAB_00149569;
        goto LAB_0014955e;
      }
      if (((local_44 == 0) || (local_5c != 0)) && (tlv_tag != local_40->tags[lVar6])) {
        ber_tlv_tag_string(local_40->tags[lVar6]);
        goto joined_r0x00149557;
      }
      local_4c = *ptr >> 5 & 1;
      if ((long)local_40->tags_count + -1 <= lVar6) {
        if ((last_tag_form == -1) || (local_4c == last_tag_form)) goto LAB_00149445;
        goto joined_r0x00149557;
      }
      if ((char)local_4c == '\0') goto joined_r0x00149557;
LAB_00149445:
      sVar2 = ber_fetch_length(local_4c,(byte *)((long)ptr + sVar1),size - sVar1,&tlv_len);
      if (sVar2 == 0) goto LAB_001494f6;
      if (sVar2 == -1) goto joined_r0x00149557;
      if (tlv_len != -1) {
        if (iVar8 == 0) {
          lVar9 = sVar2 + sVar1;
          sVar3 = tlv_len + lVar9;
          if (sVar4 == 0xffffffffffffffff) {
            if (-1 < (long)sVar3) goto LAB_001494c4;
          }
          else {
            bVar10 = sVar4 == sVar3;
            sVar3 = sVar4;
            if (bVar10) {
LAB_001494c4:
              size = size - lVar9;
              sVar4 = sVar3 - lVar9;
              if ((long)sVar4 <= (long)size) {
                size = sVar4;
              }
              iVar8 = 0;
              goto LAB_001494d3;
            }
          }
        }
        goto joined_r0x00149557;
      }
      if (sVar4 != 0xffffffffffffffff) goto joined_r0x00149557;
      iVar8 = iVar8 + 1;
      size = size - (sVar2 + sVar1);
      sVar4 = 0xffffffffffffffff;
LAB_001494d3:
      ptr = (void *)((long)ptr + sVar2 + sVar1);
      sVar5 = sVar5 + sVar2 + sVar1;
      local_5c = local_5c + 1;
    }
    if (opt_tlv_form != (int *)0x0) {
      *opt_tlv_form = local_4c;
    }
    if (iVar8 != 0) {
      tlv_len = (ber_tlv_len_t)-iVar8;
    }
    uStack_70 = 0;
    *last_length = tlv_len;
    goto LAB_00149541;
  }
  sVar1 = ber_fetch_tag(ptr,size,&tlv_tag);
  if (sVar1 == 0) {
LAB_0014952b:
    uStack_70 = 1;
  }
  else {
    if (sVar1 != -1) {
      local_4c = *ptr >> 5 & 1;
      sVar2 = ber_fetch_length(local_4c,(void *)((long)ptr + sVar1),size - sVar1,&tlv_len);
      if (sVar2 == 0) goto LAB_0014952b;
      if (sVar2 != -1) {
        sVar5 = sVar2 + sVar1;
        ptr = (void *)((long)ptr + sVar5);
        size = size - sVar5;
        goto LAB_0014938c;
      }
    }
    uStack_70 = 2;
  }
  sVar5 = 0;
LAB_00149541:
  if (opt_ctx != (asn_struct_ctx_t *)0x0) {
LAB_0014955e:
    opt_ctx->step = (short)local_5c;
  }
LAB_0014956b:
  aVar11.consumed = sVar5;
  aVar11._0_8_ = uStack_70;
  return aVar11;
}

Assistant:

asn_dec_rval_t
ber_check_tags(asn_codec_ctx_t *opt_codec_ctx,
		asn_TYPE_descriptor_t *td, asn_struct_ctx_t *opt_ctx,
		const void *ptr, size_t size, int tag_mode, int last_tag_form,
		ber_tlv_len_t *last_length, int *opt_tlv_form) {
	ssize_t consumed_myself = 0;
	ssize_t tag_len;
	ssize_t len_len;
	ber_tlv_tag_t tlv_tag;
	ber_tlv_len_t tlv_len;
	ber_tlv_len_t limit_len = -1;
	int expect_00_terminators = 0;
	int tlv_constr = -1;	/* If CHOICE, opt_tlv_form is not given */
	int step = opt_ctx ? opt_ctx->step : 0;	/* Where we left previously */
	int tagno;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		RETURN(RC_FAIL);

	/*
	 * So what does all this implicit skip stuff mean?
	 * Imagine two types,
	 * 	A ::= [5] IMPLICIT	T
	 * 	B ::= [2] EXPLICIT	T
	 * Where T is defined as
	 *	T ::= [4] IMPLICIT SEQUENCE { ... }
	 * 
	 * Let's say, we are starting to decode type A, given the
	 * following TLV stream: <5> <0>. What does this mean?
	 * It means that the type A contains type T which is,
	 * in turn, empty.
	 * Remember though, that we are still in A. We cannot
	 * just pass control to the type T decoder. Why? Because
	 * the type T decoder expects <4> <0>, not <5> <0>.
	 * So, we must make sure we are going to receive <5> while
	 * still in A, then pass control to the T decoder, indicating
	 * that the tag <4> was implicitly skipped. The decoder of T
	 * hence will be prepared to treat <4> as valid tag, and decode
	 * it appropriately.
	 */

	tagno = step	/* Continuing where left previously */
		+ (tag_mode==1?-1:0)
		;
	ASN_DEBUG("ber_check_tags(%s, size=%ld, tm=%d, step=%d, tagno=%d)",
		td->name, (long)size, tag_mode, step, tagno);
	/* assert(td->tags_count >= 1) May not be the case for CHOICE or ANY */

	if(tag_mode == 0 && tagno == td->tags_count) {
		/*
		 * This must be the _untagged_ ANY type,
		 * which outermost tag isn't known in advance.
		 * Fetch the tag and length separately.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		tlv_constr = BER_TLV_CONSTRUCTED(ptr);
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}
		ASN_DEBUG("Advancing %ld in ANY case",
			(long)(tag_len + len_len));
		ADVANCE(tag_len + len_len);
	} else {
		assert(tagno < td->tags_count);	/* At least one loop */
	}
	for((void)tagno; tagno < td->tags_count; tagno++, step++) {

		/*
		 * Fetch and process T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, size, &tlv_tag);
			ASN_DEBUG("Fetching tag from {%p,%ld}: "
				"len %ld, step %d, tagno %d got %s",
				ptr, (long)size,
				(long)tag_len, step, tagno,
				ber_tlv_tag_string(tlv_tag));
		switch(tag_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		tlv_constr = BER_TLV_CONSTRUCTED(ptr);

		/*
		 * If {I}, don't check anything.
		 * If {I,B,C}, check B and C unless we're at I.
		 */
		if(tag_mode != 0 && step == 0) {
			/*
			 * We don't expect tag to match here.
			 * It's just because we don't know how the tag
			 * is supposed to look like.
			 */
		} else {
		    assert(tagno >= 0);	/* Guaranteed by the code above */
		    if(tlv_tag != td->tags[tagno]) {
			/*
			 * Unexpected tag. Too bad.
			 */
		    	ASN_DEBUG("Expected: %s, "
				"expectation failed (tn=%d, tm=%d)",
				ber_tlv_tag_string(td->tags[tagno]),
				tagno, tag_mode
			);
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * Attention: if there are more tags expected,
		 * ensure that the current tag is presented
		 * in constructed form (it contains other tags!).
		 * If this one is the last one, check that the tag form
		 * matches the one given in descriptor.
		 */
		if(tagno < (td->tags_count - 1)) {
			if(tlv_constr == 0) {
				ASN_DEBUG("tlv_constr = %d, expfail",
					tlv_constr);
				RETURN(RC_FAIL);
			}
		} else {
			if(last_tag_form != tlv_constr
			&& last_tag_form != -1) {
				ASN_DEBUG("last_tag_form %d != %d",
					last_tag_form, tlv_constr);
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Fetch and process L from TLV.
		 */
		len_len = ber_fetch_length(tlv_constr,
			(const char *)ptr + tag_len, size - tag_len, &tlv_len);
		ASN_DEBUG("Fetching len = %ld", (long)len_len);
		switch(len_len) {
		case -1: RETURN(RC_FAIL);
		case 0: RETURN(RC_WMORE);
		}

		/*
		 * FIXME
		 * As of today, the chain of tags
		 * must either contain several indefinite length TLVs,
		 * or several definite length ones.
		 * No mixing is allowed.
		 */
		if(tlv_len == -1) {
			/*
			 * Indefinite length.
			 */
			if(limit_len == -1) {
				expect_00_terminators++;
			} else {
				ASN_DEBUG("Unexpected indefinite length "
					"in a chain of definite lengths");
				RETURN(RC_FAIL);
			}
			ADVANCE(tag_len + len_len);
			continue;
		} else {
			if(expect_00_terminators) {
				ASN_DEBUG("Unexpected definite length "
					"in a chain of indefinite lengths");
				RETURN(RC_FAIL);
			}
		}

		/*
		 * Check that multiple TLVs specify ever decreasing length,
		 * which is consistent.
		 */
		if(limit_len == -1) {
			limit_len    = tlv_len + tag_len + len_len;
			if(limit_len < 0) {
				/* Too great tlv_len value? */
				RETURN(RC_FAIL);
			}
		} else if(limit_len != tlv_len + tag_len + len_len) {
			/*
			 * Inner TLV specifies length which is inconsistent
			 * with the outer TLV's length value.
			 */
			ASN_DEBUG("Outer TLV is %ld and inner is %ld",
				(long)limit_len, (long)tlv_len);
			RETURN(RC_FAIL);
		}

		ADVANCE(tag_len + len_len);

		limit_len -= (tag_len + len_len);
		if((ssize_t)size > limit_len) {
			/*
			 * Make sure that we won't consume more bytes
			 * from the parent frame than the inferred limit.
			 */
			size = limit_len;
		}
	}

	if(opt_tlv_form)
		*opt_tlv_form = tlv_constr;
	if(expect_00_terminators)
		*last_length = -expect_00_terminators;
	else
		*last_length = tlv_len;

	RETURN(RC_OK);
}